

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

optional<bool>
ChangeRPathELF(string *file,string *oldRPath,string *newRPath,bool removeEnvironmentRPath,
              string *emsg,bool *changed)

{
  _Optional_base<bool,_true,_true> _Var1;
  AdjustCallback local_d8;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
  local_b8;
  undefined1 local_88 [8];
  anon_class_72_3_ec058f21 adjustCallback;
  bool *changed_local;
  string *emsg_local;
  bool removeEnvironmentRPath_local;
  string *newRPath_local;
  string *oldRPath_local;
  string *file_local;
  
  adjustCallback._64_8_ = changed;
  std::__cxx11::string::string((string *)local_88,(string *)oldRPath);
  std::__cxx11::string::string
            ((string *)(adjustCallback.oldRPath.field_2._M_local_buf + 8),(string *)newRPath);
  adjustCallback.newRPath.field_2._M_local_buf[8] = removeEnvironmentRPath;
  anon_unknown.dwarf_12ec9::MakeEmptyCallback(&local_b8,newRPath);
  std::
  function<bool(std::optional<std::__cxx11::string>&,std::__cxx11::string_const&,char_const*,std::__cxx11::string*)>
  ::
  function<ChangeRPathELF(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,std::__cxx11::string*,bool*)::__0&,void>
            ((function<bool(std::optional<std::__cxx11::string>&,std::__cxx11::string_const&,char_const*,std::__cxx11::string*)>
              *)&local_d8,(anon_class_72_3_ec058f21 *)local_88);
  _Var1._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload<bool,_true,_true,_true>)
       anon_unknown.dwarf_12ec9::AdjustRPathELF
                 (file,&local_b8,&local_d8,emsg,(bool *)adjustCallback._64_8_);
  std::
  function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function(&local_d8);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
  ::~function(&local_b8);
  ChangeRPathELF(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,std::__cxx11::string*,bool*)
  ::$_0::~__0((__0 *)local_88);
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)_Var1._M_payload.super__Optional_payload_base<bool>;
}

Assistant:

static cm::optional<bool> ChangeRPathELF(std::string const& file,
                                         std::string const& oldRPath,
                                         std::string const& newRPath,
                                         bool removeEnvironmentRPath,
                                         std::string* emsg, bool* changed)
{
  auto adjustCallback = [oldRPath, newRPath, removeEnvironmentRPath](
                          cm::optional<std::string>& outRPath,
                          const std::string& inRPath, const char* se_name,
                          std::string* emsg2) -> bool {
    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos = cmSystemToolsFindRPath(inRPath, oldRPath);
    if (pos == std::string::npos) {
      // If it contains the new rpath instead then it is okay.
      if (cmSystemToolsFindRPath(inRPath, newRPath) != std::string::npos) {
        return true;
      }
      if (emsg2) {
        std::ostringstream e;
        /* clang-format off */
        e << "The current " << se_name << " is:\n"
          << "  " << inRPath << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        /* clang-format on */
        *emsg2 = e.str();
      }
      return false;
    }

    std::string::size_type prefix_len = pos;

    // If oldRPath was at the end of the file's RPath, and newRPath is empty,
    // we should remove the unnecessary ':' at the end.
    if (newRPath.empty() && pos > 0 && inRPath[pos - 1] == ':' &&
        pos + oldRPath.length() == inRPath.length()) {
      prefix_len--;
    }

    // Construct the new value which preserves the part of the path
    // not being changed.
    outRPath.emplace();
    if (!removeEnvironmentRPath) {
      *outRPath += inRPath.substr(0, prefix_len);
    }
    *outRPath += newRPath;
    *outRPath += inRPath.substr(pos + oldRPath.length());

    return true;
  };

  return AdjustRPathELF(file, MakeEmptyCallback(newRPath), adjustCallback,
                        emsg, changed);
}